

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaBlockMetadata_Linear::PrintDetailedMap(VmaBlockMetadata_Linear *this,VmaJsonWriter *json)

{
  SECOND_VECTOR_MODE SVar1;
  VmaBlockMetadata_Linear *pVVar2;
  VkDeviceSize unusedRangeSize;
  long lVar3;
  VkDeviceSize VVar4;
  void **ppvVar5;
  VmaBlockMetadata_Linear *pVVar6;
  VmaBlockMetadata_Linear *pVVar7;
  VmaBlockMetadata_Linear *pVVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  VmaBlockMetadata_Linear *pVVar12;
  ulong uVar13;
  long lVar14;
  size_t unusedRangeCount;
  long lVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  VmaSuballocation *pVVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  
  bVar22 = this->m_1stVectorIndex == 0;
  bVar21 = !bVar22;
  uVar13 = (&this->m_Suballocations0)[bVar22].m_Count;
  SVar1 = this->m_2ndVectorMode;
  if (SVar1 == SECOND_VECTOR_RING_BUFFER) {
    pVVar2 = (VmaBlockMetadata_Linear *)
             (&this->m_Suballocations0)[bVar21].m_pArray[this->m_1stNullItemsBeginCount].offset;
    bVar23 = pVVar2 != (VmaBlockMetadata_Linear *)0x0;
    if (bVar23) {
      unusedRangeCount = 0;
      lVar11 = 0;
      lVar3 = 0;
      uVar9 = 0;
      pVVar12 = (VmaBlockMetadata_Linear *)0x0;
      do {
        pVVar7 = pVVar2;
        if (uVar9 < uVar13) {
          ppvVar5 = &(&this->m_Suballocations0)[bVar22].m_pArray[uVar9].userData;
          uVar10 = uVar9;
          do {
            uVar10 = uVar10 + 1;
            if (*ppvVar5 != (void *)0x0) {
              bVar23 = pVVar12 < (VmaBlockMetadata_Linear *)
                                 ((VmaSuballocation *)(ppvVar5 + -2))->offset;
              lVar3 = lVar3 + 1;
              lVar11 = lVar11 + (long)ppvVar5[-1];
              uVar9 = uVar10;
              pVVar7 = (VmaBlockMetadata_Linear *)
                       ((long)&(((VmaBlockMetadata_Linear *)
                                ((VmaSuballocation *)(ppvVar5 + -2))->offset)->
                               super_VmaBlockMetadata)._vptr_VmaBlockMetadata + (long)ppvVar5[-1]);
              break;
            }
            ppvVar5 = ppvVar5 + 4;
            uVar9 = uVar13;
          } while (uVar10 != uVar13);
        }
        unusedRangeCount = unusedRangeCount + bVar23;
        bVar23 = pVVar7 < pVVar2;
        pVVar12 = pVVar7;
      } while (bVar23);
      goto LAB_001ba62a;
    }
  }
  lVar3 = 0;
  pVVar7 = (VmaBlockMetadata_Linear *)0x0;
  lVar11 = 0;
  unusedRangeCount = 0;
LAB_001ba62a:
  pVVar2 = (VmaBlockMetadata_Linear *)(this->super_VmaBlockMetadata).m_Size;
  pVVar12 = pVVar2;
  if (SVar1 == SECOND_VECTOR_DOUBLE_STACK) {
    pVVar12 = (VmaBlockMetadata_Linear *)
              (&this->m_Suballocations0)[bVar22].m_pArray[uVar13 - 1].offset;
  }
  uVar9 = (&this->m_Suballocations0)[bVar21].m_Count;
  if (pVVar7 < pVVar12) {
    sVar16 = this->m_1stNullItemsBeginCount;
    lVar14 = 0;
    pVVar8 = pVVar7;
    do {
      pVVar6 = pVVar2;
      pVVar7 = pVVar12;
      if (sVar16 < uVar9) {
        ppvVar5 = &(&this->m_Suballocations0)[bVar21].m_pArray[sVar16].userData;
        uVar10 = sVar16;
        do {
          uVar10 = uVar10 + 1;
          if (*ppvVar5 != (void *)0x0) {
            lVar14 = lVar14 + 1;
            lVar11 = lVar11 + (long)ppvVar5[-1];
            pVVar6 = (VmaBlockMetadata_Linear *)((VmaSuballocation *)(ppvVar5 + -2))->offset;
            pVVar7 = (VmaBlockMetadata_Linear *)
                     ((long)&(((VmaBlockMetadata_Linear *)
                              ((VmaSuballocation *)(ppvVar5 + -2))->offset)->super_VmaBlockMetadata)
                             ._vptr_VmaBlockMetadata + (long)ppvVar5[-1]);
            sVar16 = uVar10;
            break;
          }
          ppvVar5 = ppvVar5 + 4;
          sVar16 = uVar9;
        } while (uVar10 != uVar9);
      }
      unusedRangeCount = unusedRangeCount + (pVVar8 < pVVar6);
      pVVar8 = pVVar7;
    } while (pVVar7 < pVVar12);
  }
  else {
    lVar14 = 0;
  }
  if ((SVar1 == SECOND_VECTOR_DOUBLE_STACK) && (bVar23 = pVVar7 < pVVar2, bVar23)) {
    lVar18 = uVar13 - 1;
    do {
      lVar15 = -1;
      pVVar8 = pVVar2;
      if (lVar18 != -1) {
        lVar17 = 1 - lVar18;
        ppvVar5 = &(&this->m_Suballocations0)[bVar22].m_pArray[lVar18].userData;
        do {
          if (*ppvVar5 != (void *)0x0) {
            bVar23 = pVVar7 < (VmaBlockMetadata_Linear *)
                              ((VmaSuballocation *)(ppvVar5 + -2))->offset;
            lVar3 = lVar3 + 1;
            lVar11 = lVar11 + (long)ppvVar5[-1];
            lVar15 = -lVar17;
            pVVar8 = (VmaBlockMetadata_Linear *)
                     ((long)&(((VmaBlockMetadata_Linear *)
                              ((VmaSuballocation *)(ppvVar5 + -2))->offset)->super_VmaBlockMetadata)
                             ._vptr_VmaBlockMetadata + (long)ppvVar5[-1]);
            break;
          }
          lVar17 = lVar17 + 1;
          ppvVar5 = ppvVar5 + -4;
        } while (lVar17 != 2);
      }
      unusedRangeCount = unusedRangeCount + bVar23;
      bVar23 = pVVar8 < pVVar2;
      pVVar7 = pVVar8;
      lVar18 = lVar15;
    } while (bVar23);
  }
  VmaBlockMetadata::PrintDetailedMap_Begin
            (&this->super_VmaBlockMetadata,json,(long)pVVar2 - lVar11,lVar3 + lVar14,
             unusedRangeCount);
  if (this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) {
    pVVar8 = (VmaBlockMetadata_Linear *)
             (&this->m_Suballocations0)[bVar21].m_pArray[this->m_1stNullItemsBeginCount].offset;
    bVar23 = pVVar8 != (VmaBlockMetadata_Linear *)0x0;
    if (pVVar8 == (VmaBlockMetadata_Linear *)0x0) {
      pVVar7 = (VmaBlockMetadata_Linear *)0x0;
    }
    else {
      uVar10 = 0;
      pVVar6 = (VmaBlockMetadata_Linear *)0x0;
      do {
        if (uVar10 < uVar13) {
          pVVar19 = (&this->m_Suballocations0)[bVar22].m_pArray + uVar10;
          uVar20 = uVar10;
          do {
            uVar20 = uVar20 + 1;
            if (pVVar19->userData != (void *)0x0) {
              VVar4 = (long)pVVar19->offset - (long)pVVar6;
              if (pVVar6 <= (VmaBlockMetadata_Linear *)pVVar19->offset && VVar4 != 0) {
                VmaBlockMetadata::PrintDetailedMap_UnusedRange
                          (&pVVar12->super_VmaBlockMetadata,json,(VkDeviceSize)pVVar6,VVar4);
              }
              VmaBlockMetadata::PrintDetailedMap_Allocation
                        (&this->super_VmaBlockMetadata,json,pVVar19->offset,pVVar19->size,
                         pVVar19->userData);
              pVVar7 = (VmaBlockMetadata_Linear *)(pVVar19->size + pVVar19->offset);
              uVar10 = uVar20;
              goto LAB_001ba888;
            }
            pVVar19 = pVVar19 + 1;
            uVar10 = uVar13;
          } while (uVar20 != uVar13);
        }
        pVVar7 = pVVar8;
        if (bVar23) {
          VmaBlockMetadata::PrintDetailedMap_UnusedRange
                    (&pVVar12->super_VmaBlockMetadata,json,(VkDeviceSize)pVVar6,
                     (long)pVVar8 - (long)pVVar6);
        }
LAB_001ba888:
        bVar23 = pVVar7 < pVVar8;
        pVVar6 = pVVar7;
      } while (bVar23);
    }
  }
  else {
    pVVar7 = (VmaBlockMetadata_Linear *)0x0;
  }
  bVar23 = pVVar7 < pVVar12;
  if (bVar23) {
    uVar13 = this->m_1stNullItemsBeginCount;
    pVVar8 = pVVar7;
    do {
      if (uVar13 < uVar9) {
        pVVar19 = (&this->m_Suballocations0)[bVar21].m_pArray + uVar13;
        uVar10 = uVar13;
        do {
          uVar10 = uVar10 + 1;
          if (pVVar19->userData != (void *)0x0) {
            VVar4 = (long)pVVar19->offset - (long)pVVar8;
            if (pVVar8 <= (VmaBlockMetadata_Linear *)pVVar19->offset && VVar4 != 0) {
              VmaBlockMetadata::PrintDetailedMap_UnusedRange
                        (&pVVar12->super_VmaBlockMetadata,json,(VkDeviceSize)pVVar8,VVar4);
            }
            VmaBlockMetadata::PrintDetailedMap_Allocation
                      (&this->super_VmaBlockMetadata,json,pVVar19->offset,pVVar19->size,
                       pVVar19->userData);
            pVVar7 = (VmaBlockMetadata_Linear *)(pVVar19->size + pVVar19->offset);
            uVar13 = uVar10;
            goto LAB_001ba95b;
          }
          pVVar19 = pVVar19 + 1;
          uVar13 = uVar9;
        } while (uVar10 != uVar9);
      }
      pVVar7 = pVVar12;
      if (bVar23) {
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&pVVar12->super_VmaBlockMetadata,json,(VkDeviceSize)pVVar8,
                   (long)pVVar12 - (long)pVVar8);
      }
LAB_001ba95b:
      bVar23 = pVVar7 < pVVar12;
      pVVar8 = pVVar7;
    } while (bVar23);
  }
  if ((this->m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK) && (bVar21 = pVVar7 < pVVar2, bVar21)) {
    lVar11 = (&this->m_Suballocations0)[bVar22].m_Count - 1;
    do {
      if (lVar11 != -1) {
        lVar3 = 1 - lVar11;
        pVVar19 = (&this->m_Suballocations0)[bVar22].m_pArray + lVar11;
        do {
          if (pVVar19->userData != (void *)0x0) {
            VVar4 = (long)pVVar19->offset - (long)pVVar7;
            if (pVVar7 <= (VmaBlockMetadata_Linear *)pVVar19->offset && VVar4 != 0) {
              VmaBlockMetadata::PrintDetailedMap_UnusedRange
                        (&pVVar12->super_VmaBlockMetadata,json,(VkDeviceSize)pVVar7,VVar4);
            }
            pVVar12 = this;
            VmaBlockMetadata::PrintDetailedMap_Allocation
                      (&this->super_VmaBlockMetadata,json,pVVar19->offset,pVVar19->size,
                       pVVar19->userData);
            lVar11 = -lVar3;
            pVVar8 = (VmaBlockMetadata_Linear *)(pVVar19->size + pVVar19->offset);
            goto LAB_001baa1d;
          }
          lVar3 = lVar3 + 1;
          pVVar19 = pVVar19 + -1;
        } while (lVar3 != 2);
      }
      lVar11 = -1;
      pVVar8 = pVVar2;
      if (bVar21) {
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&pVVar12->super_VmaBlockMetadata,json,(VkDeviceSize)pVVar7,
                   (long)pVVar2 - (long)pVVar7);
      }
LAB_001baa1d:
      bVar21 = pVVar8 < pVVar2;
      pVVar7 = pVVar8;
    } while (bVar21);
  }
  VmaJsonWriter::EndArray(json);
  return;
}

Assistant:

void VmaBlockMetadata_Linear::PrintDetailedMap(class VmaJsonWriter& json) const
{
    const VkDeviceSize size = GetSize();
    const SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    const SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
    const size_t suballoc1stCount = suballocations1st.size();
    const size_t suballoc2ndCount = suballocations2nd.size();

    // FIRST PASS

    size_t unusedRangeCount = 0;
    VkDeviceSize usedBytes = 0;

    VkDeviceSize lastOffset = 0;

    size_t alloc2ndCount = 0;
    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    size_t nextAlloc1stIndex = m_1stNullItemsBeginCount;
    size_t alloc1stCount = 0;
    const VkDeviceSize freeSpace1stTo2ndEnd =
        m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK ? suballocations2nd.back().offset : size;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                ++unusedRangeCount;
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            ++alloc1stCount;
            usedBytes += suballoc.size;

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < size)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                ++unusedRangeCount;
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    const VkDeviceSize unusedBytes = size - usedBytes;
    PrintDetailedMap_Begin(json, unusedBytes, alloc1stCount + alloc2ndCount, unusedRangeCount);

    // SECOND PASS
    lastOffset = 0;

    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    const VkDeviceSize unusedRangeSize = freeSpace2ndTo1stEnd - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    nextAlloc1stIndex = m_1stNullItemsBeginCount;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < freeSpace1stTo2ndEnd)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                const VkDeviceSize unusedRangeSize = freeSpace1stTo2ndEnd - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    const VkDeviceSize unusedRangeSize = size - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    PrintDetailedMap_End(json);
}